

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

int Wln_ObjAddFanins(Wln_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int i_00;
  int i;
  int i_01;
  
  for (i_01 = 0; i_01 < vFanins->nSize; i_01 = i_01 + 1) {
    i_00 = Vec_IntEntry(vFanins,i_01);
    Wln_ObjAddFanin(p,iObj,i_00);
  }
  return iObj;
}

Assistant:

int Wln_ObjAddFanins( Wln_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        Wln_ObjAddFanin( p, iObj, iFanin );
    return iObj;
}